

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::buildDescriptorSets
          (ComputeCacheTestInstance *this,deUint32 ndx)

{
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  DeviceInterface *pDVar1;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorPoolBuilder *this_00;
  int iVar2;
  RefBase<vk::Handle<(vk::HandleType)21>_> *pRVar3;
  deUint32 descriptorNdx;
  ulong uVar4;
  RefBase<vk::Handle<(vk::HandleType)19>_> *pRVar5;
  RefBase<vk::Handle<(vk::HandleType)22>_> *pRVar6;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptorInfos;
  Move<vk::Handle<(vk::HandleType)22>_> local_128;
  VkDescriptorSetAllocateInfo descriptorSetAllocInfo;
  DescriptorSetUpdateBuilder builder;
  DescriptorSetLayoutBuilder descLayoutBuilder;
  
  vk = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&descLayoutBuilder);
  iVar2 = 1;
  do {
    ::vk::DescriptorSetLayoutBuilder::addBinding
              (&descLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
    iVar2 = iVar2 + -1;
  } while (iVar2 == 0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetAllocInfo,&descLayoutBuilder,vk,
             device,0);
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)descriptorSetAllocInfo.descriptorPool.m_internal;
  builder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)descriptorSetAllocInfo._24_8_;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descriptorSetAllocInfo._0_8_;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descriptorSetAllocInfo.pNext;
  descriptorSetAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetAllocInfo._4_4_ = 0;
  descriptorSetAllocInfo.pNext = (void *)0x0;
  descriptorSetAllocInfo.descriptorPool.m_internal = 0;
  descriptorSetAllocInfo.descriptorSetCount = 0;
  descriptorSetAllocInfo._28_4_ = 0;
  pRVar5 = &this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>;
  obj.m_internal = (pRVar5->m_data).object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                m_data.deleter,obj);
  }
  this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = (VkDevice)
             builder.m_writeDescriptorInfos.
             super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)
                builder.m_writes.
                super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (pRVar5->m_data).object.m_internal =
       (deUint64)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (descriptorSetAllocInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetAllocInfo.pNext,
               (VkDescriptorSetLayout)descriptorSetAllocInfo._0_8_);
  }
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->m_inputBuf).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                m_internal;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x800;
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
  _M_realloc_insert<vk::VkDescriptorBufferInfo>
            (&descriptorInfos,(iterator)0x0,(VkDescriptorBufferInfo *)&builder);
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)this->m_outputBuf[ndx].super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                m_internal;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x800;
  if (descriptorInfos.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      descriptorInfos.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
    _M_realloc_insert<vk::VkDescriptorBufferInfo>
              (&descriptorInfos,
               (iterator)
               descriptorInfos.
               super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish,(VkDescriptorBufferInfo *)&builder);
  }
  else {
    (descriptorInfos.
     super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
     _M_impl.super__Vector_impl_data._M_finish)->range = 0x800;
    ((descriptorInfos.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish)->buffer).m_internal =
         (deUint64)
         builder.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (descriptorInfos.
     super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
     _M_impl.super__Vector_impl_data._M_finish)->offset = 0;
    descriptorInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         descriptorInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_128);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_128,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&descriptorSetAllocInfo,this_00,vk,device,1,1)
  ;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)descriptorSetAllocInfo.descriptorPool.m_internal;
  builder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)descriptorSetAllocInfo._24_8_;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descriptorSetAllocInfo._0_8_;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descriptorSetAllocInfo.pNext;
  descriptorSetAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetAllocInfo._4_4_ = 0;
  descriptorSetAllocInfo.pNext = (void *)0x0;
  descriptorSetAllocInfo.descriptorPool.m_internal = 0;
  descriptorSetAllocInfo.descriptorSetCount = 0;
  descriptorSetAllocInfo._28_4_ = 0;
  pRVar3 = &this->m_descriptorPool[ndx].super_RefBase<vk::Handle<(vk::HandleType)21>_>;
  obj_00.m_internal = (pRVar3->m_data).object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&this->m_descriptorPool[ndx].super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj_00);
  }
  this->m_descriptorPool[ndx].super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
       = (VkDevice)
         builder.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this->m_descriptorPool[ndx].super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)
                builder.m_writes.
                super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (pRVar3->m_data).object.m_internal =
       (deUint64)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this->m_descriptorPool[ndx].super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (descriptorSetAllocInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&descriptorSetAllocInfo.pNext,
               (VkDescriptorPool)descriptorSetAllocInfo._0_8_);
  }
  descriptorSetAllocInfo.descriptorPool.m_internal = 0;
  descriptorSetAllocInfo.descriptorSetCount = 0;
  descriptorSetAllocInfo._28_4_ = 0;
  descriptorSetAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetAllocInfo._4_4_ = 0;
  descriptorSetAllocInfo.pNext = (void *)0x0;
  if ((pointer)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal !=
      (pointer)0x0) {
    operator_delete((void *)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                            m_internal,
                    (long)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                          m_device -
                    local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                    m_internal);
  }
  descriptorSetAllocInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  descriptorSetAllocInfo.pNext = (void *)0x0;
  descriptorSetAllocInfo.descriptorPool.m_internal = (pRVar3->m_data).object.m_internal;
  descriptorSetAllocInfo.descriptorSetCount = 1;
  descriptorSetAllocInfo.pSetLayouts = (VkDescriptorSetLayout *)pRVar5;
  ::vk::allocateDescriptorSet(&local_128,vk,device,&descriptorSetAllocInfo);
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  builder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                m_internal;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                m_deviceIface;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
  pRVar6 = &this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>;
  if ((pRVar6->m_data).object.m_internal != 0) {
    pDVar1 = this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
             deleter.m_deviceIface;
    (*pDVar1->_vptr_DeviceInterface[0x3d])
              (pDVar1,this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                      m_data.deleter.m_device,
               this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
               deleter.m_pool.m_internal);
  }
  *(undefined4 *)
   &this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_device = builder.m_writeDescriptorInfos.
               super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
  *(undefined4 *)
   ((long)&this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
           m_device + 4) =
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  *(undefined4 *)
   &this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = builder.m_writes.
                 super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)
   ((long)&this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
           m_pool.m_internal + 4) =
       builder.m_writes.
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)&(pRVar6->m_data).object.m_internal =
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)
   ((long)&this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
           m_internal + 4) =
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)
   &this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_deviceIface =
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)
   ((long)&this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
           m_deviceIface + 4) =
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  if ((pointer)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal !=
      (pointer)0x0) {
    builder.m_writeDescriptorInfos.
    super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (*(local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
               ,local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               local_128.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal);
  }
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&builder);
  uVar4 = 0;
  do {
    ::vk::DescriptorSetUpdateBuilder::write
              (&builder,(int)(pRVar6->m_data).object.m_internal,(void *)(uVar4 & 0xffffffff),0);
    uVar4 = uVar4 + 1;
  } while (uVar4 == 1);
  ::vk::DescriptorSetUpdateBuilder::update(&builder,vk,device);
  if (builder.m_copies.
      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(builder.m_copies.
                    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)builder.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)builder.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (builder.m_writes.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(builder.m_writes.
                    super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)builder.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)builder.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector(&builder.m_writeDescriptorInfos);
  if (descriptorInfos.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(descriptorInfos.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)descriptorInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)descriptorInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (descLayoutBuilder.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(descLayoutBuilder.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)descLayoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)descLayoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (descLayoutBuilder.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(descLayoutBuilder.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)descLayoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)descLayoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (descLayoutBuilder.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(descLayoutBuilder.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)descLayoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)descLayoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ComputeCacheTestInstance::buildDescriptorSets (deUint32 ndx)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create descriptor set layout
	DescriptorSetLayoutBuilder descLayoutBuilder;

	for (deUint32 bindingNdx = 0u; bindingNdx < 2u; bindingNdx++)
		descLayoutBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT);

	m_descriptorSetLayout[ndx] = descLayoutBuilder.build(vk, vkDevice);

	std::vector<VkDescriptorBufferInfo>        descriptorInfos;
	descriptorInfos.push_back(makeDescriptorBufferInfo(*m_inputBuf, 0u, sizeof(tcu::Vec4) * 128u));
	descriptorInfos.push_back(makeDescriptorBufferInfo(*m_outputBuf[ndx], 0u, sizeof(tcu::Vec4) * 128u));

	// Create descriptor pool
	m_descriptorPool[ndx] = DescriptorPoolBuilder().addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2u).build(vk,
																										 vkDevice,
																										 VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
																										 1u);

	// Create descriptor set
	const VkDescriptorSetAllocateInfo descriptorSetAllocInfo =
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,     // VkStructureType                 sType;
		DE_NULL,                                            // const void*                     pNext;
		*m_descriptorPool[ndx],                             // VkDescriptorPool                descriptorPool;
		1u,                                                 // deUint32                        setLayoutCount;
		&m_descriptorSetLayout[ndx].get(),                  // const VkDescriptorSetLayout*    pSetLayouts;
	};
	m_descriptorSet[ndx] = allocateDescriptorSet(vk, vkDevice, &descriptorSetAllocInfo);

	DescriptorSetUpdateBuilder  builder;
	for (deUint32 descriptorNdx = 0u; descriptorNdx < 2u; descriptorNdx++)
	{
		builder.writeSingle(*m_descriptorSet[ndx],
							DescriptorSetUpdateBuilder::Location::binding(descriptorNdx),
							VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
							&descriptorInfos[descriptorNdx]);
	}
	builder.update(vk, vkDevice);
}